

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::f_rot(Forth *this)

{
  double Value;
  double x;
  int n;
  Forth *this_local;
  
  requireFStackDepth(this,3,"FROT");
  Value = ForthStack<double>::getTop(&this->fStack,2);
  ForthStack<double>::moveStack(&this->fStack,2,1,2);
  ForthStack<double>::setTop(&this->fStack,Value);
  return;
}

Assistant:

void f_rot() {
			REQUIRE_FSTACK_DEPTH(3, "FROT");
			auto n = 2;
			if (n > 0) {
				auto x = fStack.getTop(n);
				fStack.moveStack(n, n - 1, n);
				fStack.setTop(x);
			}
		}